

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O2

char * vrna_filename_sanitize(char *name,char *replacement)

{
  size_t sVar1;
  void *p;
  char *pcVar2;
  ulong uVar3;
  uint uVar4;
  char *pcVar5;
  
  uVar4 = 0;
  if (name == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar1 = strlen(name);
    p = vrna_alloc((int)sVar1 + 1);
    pcVar5 = name;
    while( true ) {
      pcVar2 = strpbrk(pcVar5,"\\/?%*:|\"<> ");
      if (pcVar2 == (char *)0x0) break;
      strncpy((char *)((ulong)uVar4 + (long)p),pcVar5,(long)pcVar2 - (long)pcVar5);
      uVar4 = uVar4 + (int)((long)pcVar2 - (long)pcVar5);
      if ((replacement != (char *)0x0) && (*replacement != '\0')) {
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
        *(char *)((long)p + uVar3) = *replacement;
      }
      pcVar5 = pcVar2 + 1;
    }
    sVar1 = strlen(name);
    if (pcVar5 < name + sVar1) {
      strncpy((char *)((long)p + (ulong)uVar4),pcVar5,
              (ulong)(name + (sVar1 - (long)pcVar5)) & 0xffffffff);
      uVar4 = uVar4 + (int)(name + (sVar1 - (long)pcVar5));
    }
    pcVar5 = (char *)vrna_realloc(p,uVar4 + 1);
    pcVar5[uVar4] = '\0';
    if ((*pcVar5 == '.') && ((pcVar5[1] == '\0' || ((pcVar5[1] == '.' && (pcVar5[2] == '\0')))))) {
      pcVar5 = (char *)vrna_realloc(pcVar5,1);
      *pcVar5 = '\0';
    }
    sVar1 = strlen(pcVar5);
    if ((sVar1 & 0xffffff00) != 0) {
      pcVar2 = strrchr(pcVar5,0x2e);
      if (pcVar2 != (char *)0x0) {
        pcVar2 = pcVar5 + ((sVar1 & 0xffffffff) - (long)pcVar2);
        if ((long)pcVar2 < 0xff) {
          memmove(pcVar5 + (0xff - (int)pcVar2),
                  pcVar5 + ((sVar1 & 0xffffffff) - ((ulong)pcVar2 & 0xffffffff)),
                  (ulong)pcVar2 & 0xffffffff);
        }
      }
      pcVar5 = (char *)vrna_realloc(pcVar5,0x100);
      pcVar5[0xff] = '\0';
    }
  }
  return pcVar5;
}

Assistant:

PUBLIC char *
vrna_filename_sanitize(const char *name,
                       const char *replacement)
{
  if (name) {
    const char    *ptr, *start, *illegal_chars;
    char          *sanitized_name;
    unsigned int  i, n;

    illegal_chars   = "\\/?%*:|\"<> ";
    sanitized_name  = (char *)vrna_alloc(sizeof(char) * (strlen(name) + 1));
    start           = name;
    i               = 0;
    while ((ptr = strpbrk(start, illegal_chars))) {
      /* find illegal chars */
      strncpy(sanitized_name + i, start, ptr - start);
      i += ptr - start;
      if (replacement && (*replacement))
        sanitized_name[i++] = *replacement;

      start = ptr + 1; /* skip invalid character */
    }
    /* copy remaining part */
    if (start < (name + strlen(name))) {
      unsigned int diff = name - start + strlen(name);
      strncpy(sanitized_name + i, start, diff);
      i += diff;
    }

    /* resize the output string to actual requirements */
    sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char) * (i + 1));
    sanitized_name[i] = '\0';

    /* check for reserved unix file names */
    if ((!strcmp(sanitized_name, ".")) || (!strcmp(sanitized_name, ".."))) {
      sanitized_name    = (char *)vrna_realloc(sanitized_name, sizeof(char));
      sanitized_name[0] = '\0';
    }

    /* check for length restrictions */
    n = strlen(sanitized_name);
    if (n > 255) {
      char *suff = NULL;
      /* try to leave file suffix, i.e. everything after last dot '.', intact */
      if ((suff = strrchr(sanitized_name, '.')) && (sanitized_name + n - suff < 255)) {
        unsigned int n_suff = sanitized_name + n - suff;
        memmove(sanitized_name + (255 - n_suff), sanitized_name + n - n_suff,
                sizeof(char) * n_suff);
      }

      sanitized_name      = (char *)vrna_realloc(sanitized_name, sizeof(char) * 256);
      sanitized_name[255] = '\0';
    }

    /* finally, return the sanitized file name */
    return sanitized_name;
  } else {
    return NULL;
  }
}